

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

string * __thiscall
cppcms::widgets::checkbox::identification_abi_cxx11_(string *__return_storage_ptr__,checkbox *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&(this->super_base_html_input).field_0x38);
  return __return_storage_ptr__;
}

Assistant:

std::string checkbox::identification()
{
	return identification_;
}